

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

float __thiscall cnn::Trainer::clip_gradients(Trainer *this)

{
  uint uVar1;
  ostream *this_00;
  void *this_01;
  long in_RDI;
  float fVar2;
  float gg;
  float gscale;
  Model *in_stack_00000020;
  float local_c;
  
  local_c = 1.0;
  if ((*(float *)(in_RDI + 0x1c) != 0.0) || (NAN(*(float *)(in_RDI + 0x1c)))) {
    fVar2 = Model::gradient_l2_norm(in_stack_00000020);
    uVar1 = std::isnan((double)(ulong)(uint)fVar2);
    if (((uVar1 & 1) != 0) || (uVar1 = std::isinf((double)(ulong)(uint)fVar2), (uVar1 & 1) != 0)) {
      this_00 = std::operator<<((ostream *)&std::cerr,"Magnitude of gradient is bad: ");
      this_01 = (void *)std::ostream::operator<<(this_00,fVar2);
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      abort();
    }
    if (*(float *)(in_RDI + 0x20) < fVar2) {
      *(float *)(in_RDI + 0x24) = *(float *)(in_RDI + 0x24) + 1.0;
      local_c = *(float *)(in_RDI + 0x20) / fVar2;
    }
  }
  return local_c;
}

Assistant:

float Trainer::clip_gradients() {
  float gscale = 1;
  if (clipping_enabled) {
    float gg = model->gradient_l2_norm();
    if (isnan(gg) || isinf(gg)) {
      cerr << "Magnitude of gradient is bad: " << gg << endl;
      abort();
    }
    if (gg > clip_threshold) {
      ++clips;
      gscale = clip_threshold / gg;
    }
  }
  return gscale;
}